

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoods
          (BeagleCPUImpl<double,_1,_0> *this,int bufferIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int k;
  int iVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  pdVar5 = this->gPartials[bufferIndex];
  pdVar6 = this->gCategoryWeights[categoryWeightsIndex];
  pdVar7 = this->gStateFrequencies[stateFrequenciesIndex];
  uVar3 = this->kPatternCount;
  uVar9 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    iVar10 = 0;
  }
  else {
    iVar4 = this->kStateCount;
    pdVar8 = this->integrationTmp;
    uVar13 = 0;
    iVar10 = 0;
    iVar14 = 0;
    do {
      if (0 < iVar4) {
        iVar15 = 0;
        lVar16 = 0;
        do {
          iVar15 = iVar15 + -1;
          *(double *)((long)pdVar8 + lVar16 + (long)iVar14 * 8) =
               *(double *)((long)pdVar5 + lVar16 + (long)iVar10 * 8) * *pdVar6;
          lVar16 = lVar16 + 8;
        } while (-iVar4 != iVar15);
        iVar14 = iVar14 - iVar15;
        iVar10 = iVar10 - iVar15;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar3);
  }
  iVar4 = this->kCategoryCount;
  if (1 < (long)iVar4) {
    lVar16 = 1;
    iVar14 = this->kStateCount;
    do {
      if (0 < (int)uVar3) {
        uVar13 = 0;
        iVar15 = 0;
        pdVar8 = this->integrationTmp;
        do {
          if (0 < iVar14) {
            iVar11 = 0;
            lVar17 = 0;
            do {
              auVar19._8_8_ = 0;
              auVar19._0_8_ = *(ulong *)((long)pdVar5 + lVar17 + (long)iVar10 * 8);
              auVar21._8_8_ = 0;
              auVar21._0_8_ = pdVar6[lVar16];
              iVar11 = iVar11 + -1;
              auVar20._8_8_ = 0;
              auVar20._0_8_ = *(ulong *)((long)pdVar8 + lVar17 + (long)iVar15 * 8);
              auVar20 = vfmadd213sd_fma(auVar21,auVar19,auVar20);
              *(long *)((long)pdVar8 + lVar17 + (long)iVar15 * 8) = auVar20._0_8_;
              lVar17 = lVar17 + 8;
            } while (-iVar14 != iVar11);
            iVar15 = iVar15 - iVar11;
            iVar10 = iVar10 - iVar11;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar3);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != iVar4);
  }
  if (0 < (int)uVar3) {
    lVar16 = 0;
    iVar10 = 0;
    do {
      iVar4 = this->kStateCount;
      if ((long)iVar4 < 1) {
        dVar18 = 0.0;
      }
      else {
        auVar20 = ZEXT816(0);
        lVar17 = 0;
        do {
          auVar22._8_8_ = 0;
          auVar22._0_8_ = pdVar7[lVar17];
          auVar1._8_8_ = 0;
          auVar1._0_8_ = this->integrationTmp[iVar10 + lVar17];
          auVar20 = vfmadd231sd_fma(auVar20,auVar22,auVar1);
          dVar18 = auVar20._0_8_;
          lVar17 = lVar17 + 1;
        } while (iVar4 != lVar17);
        iVar10 = iVar10 + iVar4;
      }
      dVar18 = log(dVar18);
      this->outLogLikelihoodsTmp[lVar16] = dVar18;
      lVar16 = lVar16 + 1;
      uVar9 = (ulong)this->kPatternCount;
    } while (lVar16 < (long)uVar9);
  }
  if (-1 < scalingFactorsIndex) {
    if ((int)uVar9 < 1) {
      *outSumLogLikelihood = 0.0;
      return 0;
    }
    uVar12 = 0;
    pdVar5 = this->gScaleBuffers[(uint)scalingFactorsIndex];
    pdVar6 = this->outLogLikelihoodsTmp;
    do {
      pdVar6[uVar12] = pdVar5[uVar12] + pdVar6[uVar12];
      uVar12 = uVar12 + 1;
    } while ((uVar9 & 0xffffffff) != uVar12);
  }
  *outSumLogLikelihood = 0.0;
  if ((int)uVar9 < 1) {
    return 0;
  }
  pdVar5 = this->gPatternWeights;
  pdVar6 = this->outLogLikelihoodsTmp;
  auVar20 = ZEXT816(0) << 0x40;
  uVar12 = 0;
  do {
    auVar23._8_8_ = 0;
    auVar23._0_8_ = pdVar6[uVar12];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pdVar5[uVar12];
    auVar20 = vfmadd231sd_fma(auVar20,auVar23,auVar2);
    uVar12 = uVar12 + 1;
    dVar18 = auVar20._0_8_;
    *outSumLogLikelihood = dVar18;
  } while ((uVar9 & 0xffffffff) != uVar12);
  return (uint)(!NAN(dVar18) && !NAN(dVar18)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoods(const int bufferIndex,
                            const int categoryWeightsIndex,
                            const int stateFrequenciesIndex,
                            const int scalingFactorsIndex,
                            double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];
    int u = 0;
    int v = 0;
    for (int k = 0; k < kPatternCount; k++) {
        for (int i = 0; i < kStateCount; i++) {
            integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
            u++;
            v++;
        }
        v += P_PAD;
    }
    for (int l = 1; l < kCategoryCount; l++) {
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                u++;
                v++;
            }
            v += P_PAD;
        }
    }
    u = 0;
    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE sum = 0.0;
        for (int i = 0; i < kStateCount; i++) {
            sum += freqs[i] * integrationTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sum);
    }

    if (scalingFactorsIndex >= 0) {
        const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
        for(int i=0; i<kPatternCount; i++) {
            outLogLikelihoodsTmp[i] += cumulativeScaleFactors[i];
        }
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    // TODO: merge the three kPatternCount loops above into one

    return returnCode;
}